

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNames.c
# Opt level: O0

void Abc_NtkOrderObjsByName(Abc_Ntk_t *pNtk,int fComb)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj_00;
  char *pcVar3;
  void **ppvVar4;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  int fComb_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkHasOnlyLatchBoxes(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNames.c"
                  ,0x148,"void Abc_NtkOrderObjsByName(Abc_Ntk_t *, int)");
  }
  for (local_24 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,local_24);
    pcVar3 = Abc_ObjName(pAVar2);
    (pAVar2->field_6).pTemp = pcVar3;
  }
  for (local_24 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_24);
    pcVar3 = Abc_ObjName(pAVar2);
    (pAVar2->field_6).pTemp = pcVar3;
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_24);
    pObj_00 = Abc_ObjFanout0(pAVar2);
    pcVar3 = Abc_ObjName(pObj_00);
    (pAVar2->field_6).pTemp = pcVar3;
  }
  ppvVar4 = Vec_PtrArray(pNtk->vPis);
  iVar1 = Vec_PtrSize(pNtk->vPis);
  qsort(ppvVar4,(long)iVar1,8,Abc_NodeCompareNames);
  ppvVar4 = Vec_PtrArray(pNtk->vPos);
  iVar1 = Vec_PtrSize(pNtk->vPos);
  qsort(ppvVar4,(long)iVar1,8,Abc_NodeCompareNames);
  if (fComb != 0) {
    ppvVar4 = Vec_PtrArray(pNtk->vBoxes);
    iVar1 = Vec_PtrSize(pNtk->vBoxes);
    qsort(ppvVar4,(long)iVar1,8,Abc_NodeCompareNames);
  }
  Abc_NtkOrderCisCos(pNtk);
  for (local_24 = 0; iVar1 = Abc_NtkPiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPi(pNtk,local_24);
    (pAVar2->field_6).pTemp = (void *)0x0;
  }
  for (local_24 = 0; iVar1 = Abc_NtkPoNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkPo(pNtk,local_24);
    (pAVar2->field_6).pTemp = (void *)0x0;
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_24);
    (pAVar2->field_6).pTemp = (void *)0x0;
  }
  return;
}

Assistant:

void Abc_NtkOrderObjsByName( Abc_Ntk_t * pNtk, int fComb )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );
    // temporarily store the names in the copy field
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(pObj);
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(pObj);
    Abc_NtkForEachBox( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Abc_ObjName(Abc_ObjFanout0(pObj));
    // order objects alphabetically
    qsort( (void *)Vec_PtrArray(pNtk->vPis), (size_t)Vec_PtrSize(pNtk->vPis), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareNames );
    qsort( (void *)Vec_PtrArray(pNtk->vPos), (size_t)Vec_PtrSize(pNtk->vPos), sizeof(Abc_Obj_t *), 
        (int (*)(const void *, const void *)) Abc_NodeCompareNames );
    // if the comparison if combinational (latches as PIs/POs), order them too
    if ( fComb )
        qsort( (void *)Vec_PtrArray(pNtk->vBoxes), (size_t)Vec_PtrSize(pNtk->vBoxes), sizeof(Abc_Obj_t *), 
            (int (*)(const void *, const void *)) Abc_NodeCompareNames );
    // order CIs/COs first PIs/POs(Asserts) then latches
    Abc_NtkOrderCisCos( pNtk );
    // clean the copy fields
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachBox( pNtk, pObj, i )
        pObj->pCopy = NULL;
}